

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O3

int SDT::getTypeWidth(string *type)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> t;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  pcVar3 = (type->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  switch(cVar1) {
  case 'a':
    divideType(&local_40,type);
    iVar5 = getTypeWidth(&local_40.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.second._M_dataplus._M_p != &local_40.second.field_2) {
      operator_delete(local_40.second._M_dataplus._M_p,
                      local_40.second.field_2._M_allocated_capacity + 1);
    }
    iVar5 = iVar5 * local_40.first;
    break;
  case 'c':
    iVar5 = 1;
    break;
  case 'd':
    iVar5 = 8;
    break;
  case 'f':
  case 'i':
    iVar5 = 4;
    break;
  default:
    if (cVar1 == 's') {
      if (type->_M_string_length != 0) {
        sVar7 = 0;
        iVar5 = 0;
        do {
          bVar2 = pcVar3[sVar7];
          iVar4 = (bVar2 - 0x30) + iVar5 * 10;
          if (9 < (byte)(bVar2 - 0x30)) {
            iVar4 = iVar5;
          }
          iVar5 = iVar4;
          sVar7 = sVar7 + 1;
        } while (type->_M_string_length != sVar7);
        return iVar5;
      }
      return 0;
    }
  case 'b':
  case 'e':
  case 'g':
  case 'h':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Get width of ",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(type->_M_dataplus)._M_p,type->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ERROR",6);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int getTypeWidth(const string &type){
        if(type[0]=='i') return 4;
        if(type[0]=='c') return 1;
        if(type[0]=='f') return 4;
        if(type[0]=='d') return 8;
        if(type[0]=='a'){
            auto t = divideType(type);
            return t.first*getTypeWidth(t.second);
        }
        if(type[0]=='s'){
            int num = 0;
            for(char t:type){
                if(t>='0'&&t<='9') num = num*10 + (t-'0');
            }
            return num;
        }
        cout<<"Get width of "<<type<<" ERROR"<<endl;
        return -1;
    }